

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hunk.cpp
# Opt level: O0

void __thiscall Hunk::flushContext(Hunk *this)

{
  bool bVar1;
  int in_ESI;
  QString local_58;
  QStringList local_40;
  QString local_28;
  Hunk *local_10;
  Hunk *this_local;
  
  local_10 = this;
  bVar1 = HtmlDivs::isEmpty(&this->mContext);
  if (!bVar1) {
    HtmlDivs::close(&this->mContext,in_ESI);
    HtmlDivs::divs(&local_40,&this->mContext);
    QString::QString(&local_58,"");
    QListSpecialMethods<QString>::join
              (&local_28,(QListSpecialMethods<QString> *)&local_40,&local_58);
    QList<QString>::operator<<(&this->mLines,&local_28);
    QString::~QString(&local_28);
    QString::~QString(&local_58);
    QList<QString>::~QList(&local_40);
    HtmlDivs::clear(&this->mContext);
  }
  return;
}

Assistant:

void Hunk::flushContext() {
    if (mContext.isEmpty()) {
        return;
    }
    mContext.close();
    mLines << mContext.divs().join("");
    mContext.clear();
}